

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

vector<BN,_std::allocator<BN>_> * __thiscall
BN::expBest_SlidePrecomp(vector<BN,_std::allocator<BN>_> *__return_storage_ptr__,BN *this,BN *mod)

{
  reference pvVar1;
  reference bn;
  BN local_100;
  BN local_e8;
  uint local_cc;
  undefined1 local_c8 [4];
  bt2 i;
  BN local_b0;
  BN local_98;
  undefined1 local_80 [8];
  BN g;
  BN mu;
  allocator<BN> local_39;
  undefined1 local_38 [8];
  vector<BN,_std::allocator<BN>_> garr;
  BN *mod_local;
  BN *this_local;
  
  garr.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = mod;
  std::allocator<BN>::allocator(&local_39);
  std::vector<BN,_std::allocator<BN>_>::vector
            ((vector<BN,_std::allocator<BN>_> *)local_38,0x100,&local_39);
  std::allocator<BN>::~allocator(&local_39);
  anon_unknown.dwarf_977c::reductionBarrettPrecomputation
            ((BN *)&g.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage,
             garr.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  reductionBarrett((BN *)local_80,this,
                   garr.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage,
                   (BN *)&g.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  bn1();
  pvVar1 = std::vector<BN,_std::allocator<BN>_>::operator[]
                     ((vector<BN,_std::allocator<BN>_> *)local_38,0);
  operator=(pvVar1,&local_98);
  ~BN(&local_98);
  pvVar1 = std::vector<BN,_std::allocator<BN>_>::operator[]
                     ((vector<BN,_std::allocator<BN>_> *)local_38,1);
  operator=(pvVar1,(BN *)local_80);
  Qrt((BN *)local_c8,(BN *)local_80);
  reductionBarrett(&local_b0,(BN *)local_c8,
                   garr.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage,
                   (BN *)&g.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar1 = std::vector<BN,_std::allocator<BN>_>::operator[]
                     ((vector<BN,_std::allocator<BN>_> *)local_38,2);
  operator=(pvVar1,&local_b0);
  ~BN(&local_b0);
  ~BN((BN *)local_c8);
  for (local_cc = 1; local_cc < 0x80; local_cc = local_cc + 1) {
    pvVar1 = std::vector<BN,_std::allocator<BN>_>::operator[]
                       ((vector<BN,_std::allocator<BN>_> *)local_38,(ulong)(local_cc * 2 - 1));
    bn = std::vector<BN,_std::allocator<BN>_>::operator[]
                   ((vector<BN,_std::allocator<BN>_> *)local_38,2);
    operator*(&local_100,pvVar1,bn);
    reductionBarrett(&local_e8,&local_100,
                     garr.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                     (BN *)&g.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar1 = std::vector<BN,_std::allocator<BN>_>::operator[]
                       ((vector<BN,_std::allocator<BN>_> *)local_38,(ulong)(local_cc * 2 + 1));
    operator=(pvVar1,&local_e8);
    ~BN(&local_e8);
    ~BN(&local_100);
  }
  std::vector<BN,_std::allocator<BN>_>::vector
            (__return_storage_ptr__,(vector<BN,_std::allocator<BN>_> *)local_38);
  ~BN((BN *)local_80);
  ~BN((BN *)&g.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::vector<BN,_std::allocator<BN>_>::~vector((vector<BN,_std::allocator<BN>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

vector<BN> BN::expBest_SlidePrecomp(const BN& mod) const {
    vector <BN> garr (KarySize);
    BN mu = reductionBarrettPrecomputation(mod);
    BN g = this -> reductionBarrett(mod, mu);
    garr[0] = BN::bn1();
    garr[1] = g;
    garr[2] = g.Qrt().reductionBarrett(mod,mu);
    for(bt2 i = 1; i < KarySize/ 2; i++)
        garr[2 * i + 1] = (garr[2 * i - 1] * garr[2]).reductionBarrett(mod,mu);
    return move(garr);

}